

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

int __thiscall
METADemuxer::addStream
          (METADemuxer *this,string *codec,string *codecStreamName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams)

{
  _Rb_tree_header *p_Var1;
  ContainerToReaderWrapper *this_00;
  pointer pbVar2;
  pointer pSVar3;
  undefined8 uVar4;
  pointer pMVar5;
  __type _Var6;
  bool bVar7;
  byte bVar8;
  int32_t iVar9;
  int iVar10;
  int32_t iVar11;
  const_iterator cVar12;
  iterator iVar13;
  iterator iVar14;
  AbstractStreamReader *pAVar15;
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  ostream *poVar19;
  string *codecStreamName_00;
  uint uVar20;
  string *fileName_1;
  pointer pbVar21;
  MPLSStreamInfo *pMVar22;
  ContainerToReaderWrapper *pCVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  MPLSParser *this_01;
  allocator<char> local_44a;
  allocator<char> local_449;
  int32_t pid;
  bool isSubStream;
  AbstractStreamReader *codecReader;
  allocator<char> local_432;
  allocator<char> local_431;
  string local_430;
  AbstractReader *dataReader;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  ContainerType local_3dc;
  uint local_3d8;
  uint local_3d4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mplsNames;
  long local_3b0;
  string tmpname;
  string local_340;
  MPLSStreamInfo streamInfo;
  FileListIterator *listIterator;
  vector<MPLSParser,_std::allocator<MPLSParser>_> mplsInfoList;
  uint *local_170;
  undefined8 local_168;
  uint local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  uint *local_150;
  undefined8 local_148;
  uint local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  uint *local_130;
  undefined8 local_128;
  uint local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  uint *local_110;
  undefined8 local_108;
  uint local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  uint *local_f0;
  undefined8 local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  uint *local_d0;
  undefined8 local_c8;
  uint local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  uint *local_b0;
  undefined8 local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  uint *local_90;
  undefined8 local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string fileExt;
  string unquotedStreamName;
  
  pid = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&streamInfo,"track",(allocator<char> *)&tmpname);
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&streamInfo);
  std::__cxx11::string::~string((string *)&streamInfo);
  p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar12._M_node != p_Var1) {
    pid = strToInt32(*(char **)(cVar12._M_node + 2));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&streamInfo,"subTrack",(allocator<char> *)&tmpname);
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&streamInfo);
  std::__cxx11::string::~string((string *)&streamInfo);
  iVar11 = pid;
  if ((_Rb_tree_header *)cVar12._M_node != p_Var1) {
    iVar9 = strToInt32((string *)(cVar12._M_node + 2));
    pid = iVar11 * 0x10000 + iVar9;
  }
  fileList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fileList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fileList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unquoteStr(&unquotedStreamName,codecStreamName);
  extractFileExt((string *)&streamInfo,codecStreamName);
  strToLowerCase(&fileExt,(string *)&streamInfo);
  std::__cxx11::string::~string((string *)&streamInfo);
  mplsInfoList.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mplsInfoList.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mplsInfoList.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var6 = std::operator==(codec,&::h264DepCodecInfo.programName);
  isSubStream = true;
  if (!_Var6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&streamInfo,"subClip",(allocator<char> *)&tmpname);
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&streamInfo);
    isSubStream = (_Rb_tree_header *)cVar12._M_node != p_Var1;
    std::__cxx11::string::~string((string *)&streamInfo);
  }
  bVar7 = std::operator==(&fileExt,"mpls");
  if ((bVar7) || (bVar7 = std::operator==(&fileExt,"mpl"), bVar7)) {
    getMplsInfo((vector<MPLSParser,_std::allocator<MPLSParser>_> *)&streamInfo,this,codecStreamName)
    ;
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::_M_move_assign(&mplsInfoList,&streamInfo);
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
              ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)&streamInfo);
    splitQuotedStr_abi_cxx11_(&mplsNames,(codecStreamName->_M_dataplus)._M_p,'+');
    local_3dc = 0xff;
    bVar8 = 0;
    local_3d8 = 0xffffffff;
    local_3d4 = local_3d8;
    for (uVar25 = 0;
        pMVar5 = mplsInfoList.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar25 < (ulong)(((long)mplsInfoList.
                                super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)mplsInfoList.
                               super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0xb0); uVar25 = uVar25 + 1) {
      unquoteStr((string *)&streamInfo,
                 mplsNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar25);
      this_01 = pMVar5 + uVar25;
      std::__cxx11::string::operator=((string *)&unquotedStreamName,(string *)&streamInfo);
      std::__cxx11::string::~string((string *)&streamInfo);
      local_3b0 = 8;
      for (uVar24 = 0;
          uVar24 < (ulong)(((long)(this_01->m_playItems).
                                  super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->m_playItems).
                                 super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
                                 _M_impl.super__Vector_impl_data._M_start) / 0x30);
          uVar24 = uVar24 + 1) {
        tmpname._M_dataplus._M_p = (pointer)&tmpname.field_2;
        tmpname._M_string_length = 0;
        tmpname.field_2._M_local_buf[0] = '\0';
        if (isSubStream == true) {
          pbVar2 = (this_01->m_mvcFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 = (this_01->m_mvcFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar2 == pbVar21) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
            std::operator<<((ostream *)&streamInfo,
                            "Current playlist file doesn\'t has MVC track info. Please, remove MVC track from the track list"
                           );
            puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar18 = 0x1f6;
            *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
            if (local_90 == &local_80) {
              puVar18[6] = local_80;
              puVar18[7] = uStack_7c;
              puVar18[8] = uStack_78;
              puVar18[9] = uStack_74;
            }
            else {
              *(uint **)(puVar18 + 2) = local_90;
              *(ulong *)(puVar18 + 6) = CONCAT44(uStack_7c,local_80);
            }
            *(undefined8 *)(puVar18 + 4) = local_88;
            local_88 = 0;
            local_80 = local_80 & 0xffffff00;
            local_90 = &local_80;
            __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if ((ulong)((long)pbVar21 - (long)pbVar2 >> 5) <= uVar24) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
            std::operator<<((ostream *)&streamInfo,
                            "Bad playlist file: number of CLPI files for AVC and VMC parts do not match"
                           );
            puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar18 = 0x1f6;
            *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
            if (local_b0 == &local_a0) {
              puVar18[6] = local_a0;
              puVar18[7] = uStack_9c;
              puVar18[8] = uStack_98;
              puVar18[9] = uStack_94;
            }
            else {
              *(uint **)(puVar18 + 2) = local_b0;
              *(ulong *)(puVar18 + 6) = CONCAT44(uStack_9c,local_a0);
            }
            *(undefined8 *)(puVar18 + 4) = local_a8;
            local_a8 = 0;
            local_a0 = local_a0 & 0xffffff00;
            local_b0 = &local_a0;
            __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        std::__cxx11::string::_M_assign((string *)&tmpname);
        mplsTrackToFullName((string *)&streamInfo,&unquotedStreamName,&tmpname);
        if ((this_01->isDependStreamExist == true) &&
           (bVar7 = fileExists((string *)&streamInfo), !bVar7)) {
          mplsTrackToSSIFName(&local_430,&unquotedStreamName,
                              (string *)
                              ((long)&((this_01->m_playItems).
                                       super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->IN_time +
                              local_3b0));
          std::__cxx11::string::operator=((string *)&streamInfo,(string *)&local_430);
          std::__cxx11::string::~string((string *)&local_430);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&fileList,(value_type *)&streamInfo);
        std::__cxx11::string::~string((string *)&streamInfo);
        std::__cxx11::string::~string((string *)&tmpname);
        local_3b0 = local_3b0 + 0x30;
      }
      MPLSParser::getStreamByPID(&streamInfo,this_01,pid);
      if ((streamInfo.super_M2TSStreamInfo.stream_coding_type == SUB_PGS) &&
         (streamInfo.isSSPG == true)) {
        local_3d4 = addPGSubStream(this,codec,&unquotedStreamName,addParams,streamInfo.leftEye);
        local_3d8 = addPGSubStream(this,codec,&unquotedStreamName,addParams,streamInfo.rightEye);
        local_3dc = streamInfo.SS_PG_offset_sequence_id;
        bVar8 = streamInfo.isSSPG;
      }
      MPLSStreamInfo::~MPLSStreamInfo(&streamInfo);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&mplsNames);
    bVar8 = bVar8 & 1;
  }
  else {
    extractFileList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&streamInfo,codecStreamName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&fileList,&streamInfo);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&streamInfo);
    local_3dc = 0xff;
    bVar8 = 0;
    local_3d8 = 0xffffffff;
    local_3d4 = local_3d8;
  }
  uVar25 = (ulong)((long)fileList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)fileList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 5;
  while( true ) {
    pbVar2 = fileList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (int)uVar25 - 1;
    codecReader = (AbstractStreamReader *)CONCAT44(codecReader._4_4_,uVar20);
    if ((int)uVar25 < 1) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mplsNames,"_#",(allocator<char> *)&dataReader);
    std::operator+(&local_430,pbVar2 + uVar20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mplsNames);
    int32ToStr_abi_cxx11_(&local_340,(int32_t *)&codecReader);
    std::operator+(&tmpname,&local_430,&local_340);
    std::__cxx11::string::string<std::allocator<char>>((string *)&listIterator,"_",&local_44a);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&streamInfo,
                   &tmpname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &listIterator);
    std::__cxx11::string::~string((string *)&listIterator);
    std::__cxx11::string::~string((string *)&tmpname);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&mplsNames);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tmpname,"subClip",(allocator<char> *)&local_430);
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,&tmpname);
    std::__cxx11::string::~string((string *)&tmpname);
    if ((_Rb_tree_header *)cVar12._M_node == p_Var1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpname,"_track_",(allocator<char> *)&local_430);
      std::__cxx11::string::append((string *)&streamInfo);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpname,"_subtrack_",(allocator<char> *)&local_430);
      std::__cxx11::string::append((string *)&streamInfo);
    }
    std::__cxx11::string::~string((string *)&tmpname);
    int32ToStr_abi_cxx11_(&tmpname,&pid);
    std::__cxx11::string::append((string *)&streamInfo);
    std::__cxx11::string::~string((string *)&tmpname);
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&(this->m_processedTracks)._M_t,(key_type *)&streamInfo);
    if ((_Rb_tree_header *)iVar13._M_node ==
        &(this->m_processedTracks)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_processedTracks,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&streamInfo);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&fileList,
              fileList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (int)codecReader);
    }
    std::__cxx11::string::~string((string *)&streamInfo);
    uVar25 = (ulong)codecReader & 0xffffffff;
  }
  if (fileList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      fileList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar10 = -1;
    goto LAB_001b30ce;
  }
  listIterator = (FileListIterator *)0x0;
  if (0x20 < (ulong)((long)fileList.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)fileList.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    listIterator = (FileListIterator *)operator_new(0x28);
    (listIterator->super_FileNameIterator)._vptr_FileNameIterator =
         (_func_int **)&PTR_getNextName_abi_cxx11__0024b328;
    (listIterator->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (listIterator->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (listIterator->m_files).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    listIterator->m_index = 0;
    std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>::push_back
              (&this->m_iterators,&listIterator);
    pbVar2 = fileList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar21 = fileList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar2;
        pbVar21 = pbVar21 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&listIterator->m_files,pbVar21);
    }
  }
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
           ::find(&(this->m_containerReader).m_demuxers._M_t,
                  fileList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  if ((_Rb_tree_header *)iVar14._M_node ==
      &(this->m_containerReader).m_demuxers._M_t._M_impl.super__Rb_tree_header) {
    File::File((File *)&tmpname);
    pbVar2 = fileList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar26 = 0;
    for (pbVar21 = fileList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar2;
        pbVar21 = pbVar21 + 1) {
      iVar10 = File::open((File *)&tmpname,(pbVar21->_M_dataplus)._M_p,1,0);
      if ((char)iVar10 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
        poVar19 = std::operator<<((ostream *)&streamInfo,"Can\'t open file: ");
        std::operator<<(poVar19,(pbVar21->_M_dataplus)._M_p);
        puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar18 = 0x1f6;
        *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
        if (local_d0 == &local_c0) {
          puVar18[6] = local_c0;
          puVar18[7] = uStack_bc;
          puVar18[8] = uStack_b8;
          puVar18[9] = uStack_b4;
        }
        else {
          *(uint **)(puVar18 + 2) = local_d0;
          *(ulong *)(puVar18 + 6) = CONCAT44(uStack_bc,local_c0);
        }
        *(undefined8 *)(puVar18 + 4) = local_c8;
        local_c8 = 0;
        local_c0 = local_c0 & 0xffffff00;
        local_d0 = &local_c0;
        __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      streamInfo.super_M2TSStreamInfo.streamPID = 0;
      streamInfo.super_M2TSStreamInfo.stream_coding_type = RESERVED;
      pMVar22 = &streamInfo;
      File::size((File *)&tmpname,(int64_t *)&streamInfo);
      uVar4 = streamInfo.super_M2TSStreamInfo._0_8_;
      File::close((File *)&tmpname,(int)pMVar22);
      lVar26 = lVar26 + uVar4;
    }
    File::~File((File *)&tmpname);
  }
  else {
    lVar26 = 0;
  }
  mergePlayItems((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&streamInfo,&mplsInfoList);
  pAVar15 = createCodec(codec,addParams,codecStreamName_00,
                        (vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&streamInfo);
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector
            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&streamInfo);
  lVar16 = (long)(this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  codecReader = pAVar15;
  (*(pAVar15->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0xb])
            (pAVar15,(ulong)((int)(lVar16 / 0x110) + 1),lVar16 % 0x110);
  (*(codecReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0xc])
            (codecReader,(this->super_AbstractDemuxer).m_timeOffset);
  if ((this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    codecReader->m_flags = codecReader->m_flags | 1;
  }
  strToLowerCase(&tmpname,fileList.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  trimStr(&local_430,&tmpname);
  unquoteStr((string *)&streamInfo,&local_430);
  std::__cxx11::string::operator=((string *)&tmpname,(string *)&streamInfo);
  std::__cxx11::string::~string((string *)&streamInfo);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&streamInfo,".h264",(allocator<char> *)&local_340);
  bVar7 = strEndWith(&tmpname,(string *)&streamInfo);
  this_00 = &this->m_containerReader;
  dataReader = &this_00->super_AbstractReader;
  if (bVar7) {
LAB_001b2bf2:
    std::__cxx11::string::~string((string *)&streamInfo);
LAB_001b2bff:
    if (pid == 0) {
      dataReader = BufferedReaderManager::getReader
                             (this->m_readManager,
                              ((fileList.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    }
    else {
      codecReader->m_containerType = ctMultiH264;
      if (listIterator != (FileListIterator *)0x0) {
        ContainerToReaderWrapper::setFileIterator
                  (this_00,((fileList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                   &listIterator->super_FileNameIterator);
      }
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,".264",&local_44a);
    bVar7 = strEndWith(&tmpname,&local_430);
    if (bVar7) {
      std::__cxx11::string::~string((string *)&local_430);
      goto LAB_001b2bf2;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&mplsNames,".mvc",&local_449);
    bVar7 = strEndWith(&tmpname,(string *)&mplsNames);
    std::__cxx11::string::~string((string *)&mplsNames);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&streamInfo);
    if (bVar7) goto LAB_001b2bff;
    std::__cxx11::string::string<std::allocator<char>>((string *)&streamInfo,".ts",&local_44a);
    bVar7 = strEndWith(&tmpname,(string *)&streamInfo);
    if (bVar7) {
LAB_001b2eec:
      std::__cxx11::string::~string((string *)&streamInfo);
LAB_001b2ef9:
      if (pid == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
        std::operator<<((ostream *)&streamInfo,
                        "For streams inside TS/M2TS container need track parameter.");
        puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar18 = 0x1f6;
        *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
        if (local_f0 == &local_e0) {
          puVar18[6] = local_e0;
          puVar18[7] = uStack_dc;
          puVar18[8] = uStack_d8;
          puVar18[9] = uStack_d4;
        }
        else {
          *(uint **)(puVar18 + 2) = local_f0;
          *(ulong *)(puVar18 + 6) = CONCAT44(uStack_dc,local_e0);
        }
        *(undefined8 *)(puVar18 + 4) = local_e8;
        local_e8 = 0;
        local_e0 = local_e0 & 0xffffff00;
        local_f0 = &local_e0;
        __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      if (listIterator != (FileListIterator *)0x0) {
        pCVar23 = (ContainerToReaderWrapper *)0x0;
        if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
            (_func_int **)&PTR__ContainerToReaderWrapper_0024b278) {
          pCVar23 = this_00;
        }
        ContainerToReaderWrapper::setFileIterator
                  (pCVar23,((fileList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                   &listIterator->super_FileNameIterator);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&streamInfo,".ts",(allocator<char> *)&local_430);
      bVar7 = strEndWith(&tmpname,(string *)&streamInfo);
      std::__cxx11::string::~string((string *)&streamInfo);
      if (bVar7) {
        codecReader->m_containerType = ctTS;
      }
      else {
        codecReader->m_containerType = ctM2TS;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,".m2ts",&local_449);
      bVar7 = strEndWith(&tmpname,&local_430);
      if (bVar7) {
LAB_001b2ee2:
        std::__cxx11::string::~string((string *)&local_430);
        goto LAB_001b2eec;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&mplsNames,".mts",&local_431);
      bVar7 = strEndWith(&tmpname,(string *)&mplsNames);
      if (bVar7) {
        std::__cxx11::string::~string((string *)&mplsNames);
        goto LAB_001b2ee2;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,".ssif",&local_432);
      bVar7 = strEndWith(&tmpname,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&mplsNames);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&streamInfo);
      if (bVar7) goto LAB_001b2ef9;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&streamInfo,".vob",(allocator<char> *)&local_340);
      bVar7 = strEndWith(&tmpname,(string *)&streamInfo);
      if (bVar7) {
LAB_001b320b:
        std::__cxx11::string::~string((string *)&streamInfo);
LAB_001b3218:
        if (pid == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
          std::operator<<((ostream *)&streamInfo,
                          "For streams inside MPG/VOB/EVO container need track parameter.");
          puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar18 = 0x1f6;
          *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
          if (local_110 == &local_100) {
            puVar18[6] = local_100;
            puVar18[7] = uStack_fc;
            puVar18[8] = uStack_f8;
            puVar18[9] = uStack_f4;
          }
          else {
            *(uint **)(puVar18 + 2) = local_110;
            *(ulong *)(puVar18 + 6) = CONCAT44(uStack_fc,local_100);
          }
          *(undefined8 *)(puVar18 + 4) = local_108;
          local_108 = 0;
          local_100 = local_100 & 0xffffff00;
          local_110 = &local_100;
          __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        if (listIterator != (FileListIterator *)0x0) {
          pCVar23 = (ContainerToReaderWrapper *)0x0;
          if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
              (_func_int **)&PTR__ContainerToReaderWrapper_0024b278) {
            pCVar23 = this_00;
          }
          ContainerToReaderWrapper::setFileIterator
                    (pCVar23,((fileList.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                     &listIterator->super_FileNameIterator);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&streamInfo,".evo",(allocator<char> *)&mplsNames);
        bVar7 = strEndWith(&tmpname,(string *)&streamInfo);
        if (bVar7) {
          std::__cxx11::string::~string((string *)&streamInfo);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,".evo\"",(allocator<char> *)&local_340);
          bVar7 = strEndWith(&tmpname,&local_430);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&streamInfo);
          if (!bVar7) {
            codecReader->m_containerType = ctVOB;
            goto LAB_001b2c54;
          }
        }
        codecReader->m_containerType = ctEVOB;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,".evo",&local_44a);
        bVar7 = strEndWith(&tmpname,&local_430);
        if (bVar7) {
          std::__cxx11::string::~string((string *)&local_430);
          goto LAB_001b320b;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&mplsNames,".mpg",&local_449);
        bVar7 = strEndWith(&tmpname,(string *)&mplsNames);
        std::__cxx11::string::~string((string *)&mplsNames);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&streamInfo);
        if (bVar7) goto LAB_001b3218;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&streamInfo,".mkv",(allocator<char> *)&local_340);
        bVar7 = strEndWith(&tmpname,(string *)&streamInfo);
        if (bVar7) {
LAB_001b33be:
          std::__cxx11::string::~string((string *)&streamInfo);
LAB_001b33cb:
          if (pid == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
            std::operator<<((ostream *)&streamInfo,
                            "For streams inside MKV container need track parameter.");
            puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar18 = 0x1f6;
            *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
            if (local_130 == &local_120) {
              puVar18[6] = local_120;
              puVar18[7] = uStack_11c;
              puVar18[8] = uStack_118;
              puVar18[9] = uStack_114;
            }
            else {
              *(uint **)(puVar18 + 2) = local_130;
              *(ulong *)(puVar18 + 6) = CONCAT44(uStack_11c,local_120);
            }
            *(undefined8 *)(puVar18 + 4) = local_128;
            local_128 = 0;
            local_120 = local_120 & 0xffffff00;
            local_130 = &local_120;
            __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if (listIterator != (FileListIterator *)0x0) {
            pCVar23 = (ContainerToReaderWrapper *)0x0;
            if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
                (_func_int **)&PTR__ContainerToReaderWrapper_0024b278) {
              pCVar23 = this_00;
            }
            ContainerToReaderWrapper::setFileIterator
                      (pCVar23,((fileList.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                       &listIterator->super_FileNameIterator);
          }
          codecReader->m_containerType = ctMKV;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,".mka",&local_44a)
          ;
          bVar7 = strEndWith(&tmpname,&local_430);
          if (bVar7) {
            std::__cxx11::string::~string((string *)&local_430);
            goto LAB_001b33be;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&mplsNames,".mks",&local_449)
          ;
          bVar7 = strEndWith(&tmpname,(string *)&mplsNames);
          std::__cxx11::string::~string((string *)&mplsNames);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&streamInfo);
          if (bVar7) goto LAB_001b33cb;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&streamInfo,".mov",&local_44a);
          bVar7 = strEndWith(&tmpname,(string *)&streamInfo);
          if (bVar7) {
LAB_001b3614:
            std::__cxx11::string::~string((string *)&streamInfo);
LAB_001b3621:
            if (pid == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
              std::operator<<((ostream *)&streamInfo,
                              "For streams inside MOV/MP4 container need track parameter.");
              puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar18 = 0x1f6;
              *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
              if (local_150 == &local_140) {
                puVar18[6] = local_140;
                puVar18[7] = uStack_13c;
                puVar18[8] = uStack_138;
                puVar18[9] = uStack_134;
              }
              else {
                *(uint **)(puVar18 + 2) = local_150;
                *(ulong *)(puVar18 + 6) = CONCAT44(uStack_13c,local_140);
              }
              *(undefined8 *)(puVar18 + 4) = local_148;
              local_148 = 0;
              local_140 = local_140 & 0xffffff00;
              local_150 = &local_140;
              __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            if (listIterator != (FileListIterator *)0x0) {
              pCVar23 = (ContainerToReaderWrapper *)0x0;
              if ((this_00->super_AbstractReader)._vptr_AbstractReader ==
                  (_func_int **)&PTR__ContainerToReaderWrapper_0024b278) {
                pCVar23 = this_00;
              }
              ContainerToReaderWrapper::setFileIterator
                        (pCVar23,((fileList.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         &listIterator->super_FileNameIterator);
            }
            codecReader->m_containerType = ctMOV;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_430,".mp4",&local_449);
            bVar7 = strEndWith(&tmpname,&local_430);
            if (bVar7) {
LAB_001b360a:
              std::__cxx11::string::~string((string *)&local_430);
              goto LAB_001b3614;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&mplsNames,".m4v",&local_431);
            bVar7 = strEndWith(&tmpname,(string *)&mplsNames);
            if (bVar7) {
              std::__cxx11::string::~string((string *)&mplsNames);
              goto LAB_001b360a;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_340,".m4a",&local_432);
            bVar7 = strEndWith(&tmpname,&local_340);
            std::__cxx11::string::~string((string *)&local_340);
            std::__cxx11::string::~string((string *)&mplsNames);
            std::__cxx11::string::~string((string *)&local_430);
            std::__cxx11::string::~string((string *)&streamInfo);
            if (bVar7) goto LAB_001b3621;
            dataReader = BufferedReaderManager::getReader
                                   (this->m_readManager,
                                    ((fileList.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p)
            ;
          }
        }
      }
    }
  }
LAB_001b2c54:
  if (dataReader == (AbstractReader *)0x0) {
    if (codecReader != (AbstractStreamReader *)0x0) {
      (*(codecReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[1])();
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&streamInfo);
    std::operator<<((ostream *)&streamInfo,
                    "This version do not support multicast or other network steams for muxing");
    puVar18 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar18 = 0x1f6;
    *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
    if (local_170 == &local_160) {
      puVar18[6] = local_160;
      puVar18[7] = uStack_15c;
      puVar18[8] = uStack_158;
      puVar18[9] = uStack_154;
    }
    else {
      *(uint **)(puVar18 + 2) = local_170;
      *(ulong *)(puVar18 + 6) = CONCAT44(uStack_15c,local_160);
    }
    *(undefined8 *)(puVar18 + 4) = local_168;
    local_160 = local_160 & 0xffffff00;
    __cxa_throw(puVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  std::vector<StreamInfo,std::allocator<StreamInfo>>::
  emplace_back<AbstractReader*&,AbstractStreamReader*&,std::__cxx11::string&,std::__cxx11::string_const&,int&,bool&>
            ((vector<StreamInfo,std::allocator<StreamInfo>> *)&this->m_codecInfo,&dataReader,
             &codecReader,
             fileList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,codecStreamName,&pid,&isSubStream);
  if (((listIterator != (FileListIterator *)0x0) && (dataReader != (AbstractReader *)0x0)) &&
     (dataReader->_vptr_AbstractReader == (_func_int **)&PTR__BufferedReader_00249e70)) {
    BufferedReader::setFileIterator
              ((BufferedReader *)dataReader,&listIterator->super_FileNameIterator,
               (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].m_readerID);
  }
  pSVar3 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)&pSVar3[-1].m_codec);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&pSVar3[-1].m_addParams._M_t,&addParams->_M_t);
  if ((codecReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader ==
      (_func_int **)&PTR__PGSStreamReader_0024c208) {
    *(byte *)&codecReader[1].super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader = bVar8;
    codecReader[1].m_containerType = local_3dc;
    *(uint *)((long)&codecReader[1].super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader +
             4) = local_3d4;
    codecReader[1].m_flags = local_3d8;
  }
  iVar10 = codecReader->m_streamIndex;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&streamInfo,"timeshift",(allocator<char> *)&local_430);
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&streamInfo);
  std::__cxx11::string::~string((string *)&streamInfo);
  if ((_Rb_tree_header *)cVar12._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&streamInfo,(string *)(cVar12._M_node + 2));
    lVar16 = std::__cxx11::string::find((char *)&streamInfo,0x20c711);
    if (lVar16 == -1) {
      lVar16 = std::__cxx11::string::find((char)&streamInfo,0x73);
      if (lVar16 == -1) {
        lVar16 = std::__cxx11::string::find((char *)&streamInfo,0x20ce89);
        if (lVar16 == -1) {
          iVar11 = strToInt32((char *)streamInfo.super_M2TSStreamInfo._0_8_);
          goto LAB_001b2ddb;
        }
        std::__cxx11::string::substr((ulong)&local_430,(ulong)&streamInfo);
        iVar11 = strToInt32(local_430._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_430);
        lVar16 = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_430,(ulong)&streamInfo);
        iVar11 = strToInt32(local_430._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_430);
        lVar16 = 1000000000;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_430,(ulong)&streamInfo);
      iVar11 = strToInt32(local_430._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_430);
LAB_001b2ddb:
      lVar16 = 1000000;
    }
    lVar17 = ((iVar11 * lVar16) / 1000) * 0x14ac;
    pSVar3[-1].m_timeShift = lVar17;
    if (999 < iVar11 * lVar16) {
      pSVar3[-1].m_lastDTS = lVar17;
    }
    std::__cxx11::string::~string((string *)&streamInfo);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&streamInfo,"lang",(allocator<char> *)&local_430);
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&streamInfo);
  std::__cxx11::string::~string((string *)&streamInfo);
  if ((_Rb_tree_header *)cVar12._M_node != p_Var1) {
    std::__cxx11::string::_M_assign((string *)&pSVar3[-1].m_lang);
  }
  this->m_totalSize = this->m_totalSize + lVar26;
  std::__cxx11::string::~string((string *)&tmpname);
LAB_001b30ce:
  std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector(&mplsInfoList);
  std::__cxx11::string::~string((string *)&fileExt);
  std::__cxx11::string::~string((string *)&unquotedStreamName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fileList);
  return iVar10;
}

Assistant:

int METADemuxer::addStream(const string& codec, const string& codecStreamName, const map<string, string>& addParams)
{
    int32_t pid = 0;
    auto tmpitr = addParams.find("track");
    if (tmpitr != addParams.end())
        pid = strToInt32(tmpitr->second.c_str());

    tmpitr = addParams.find("subTrack");
    if (tmpitr != addParams.end())
        pid = SubTrackFilter::pidToSubPid(pid, strToInt32(tmpitr->second));

    vector<string> fileList;
    string unquotedStreamName = unquoteStr(codecStreamName);
    string fileExt = strToLowerCase(extractFileExt(codecStreamName));
    std::vector<MPLSParser> mplsInfoList;

    // filds for SS PG
    int leftEyeSubStreamIdx = -1;
    int rightEyeSubStreamIdx = -1;
    bool isSSPG = false;
    int ssPGOffset = 0xff;
    ////

    bool isSubStream = (codec == h264DepCodecInfo.programName) || addParams.find("subClip") != addParams.end();
    if (fileExt == "mpls" || fileExt == "mpl")
    {
        mplsInfoList = getMplsInfo(codecStreamName);
        vector<string> mplsNames = splitQuotedStr(codecStreamName.c_str(), '+');
        for (size_t k = 0; k < mplsInfoList.size(); ++k)
        {
            MPLSParser& mplsInfo = mplsInfoList[k];
            unquotedStreamName = unquoteStr(mplsNames[k]);
            for (size_t i = 0; i < mplsInfo.m_playItems.size(); ++i)
            {
                string playItemName;
                if (isSubStream)
                {
                    if (mplsInfo.m_mvcFiles.empty())
                    {
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Current playlist file doesn't has MVC track info. Please, remove MVC track from the "
                              "track list")
                    }
                    if (mplsInfo.m_mvcFiles.size() <= i)
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Bad playlist file: number of CLPI files for AVC and VMC parts do not match")
                    playItemName = mplsInfo.m_mvcFiles[i];
                }
                else
                {
                    playItemName = mplsInfo.m_playItems[i].fileName;
                }
                string fileName = mplsTrackToFullName(unquotedStreamName, playItemName);
                if (mplsInfo.isDependStreamExist && !fileExists(fileName))
                    fileName = mplsTrackToSSIFName(unquotedStreamName, mplsInfo.m_playItems[i].fileName);
                fileList.push_back(fileName);
            }

            MPLSStreamInfo streamInfo = mplsInfo.getStreamByPID(pid);
            if (streamInfo.stream_coding_type == StreamType::SUB_PGS && streamInfo.isSSPG)
            {
                // add refs to addition tracks for stereo subtitles
                leftEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.leftEye);
                rightEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.rightEye);

                isSSPG = streamInfo.isSSPG;
                ssPGOffset = streamInfo.SS_PG_offset_sequence_id;
            }
        }
    }
    else
    {
        fileList = extractFileList(codecStreamName);
    }

    for (int i = static_cast<int>(fileList.size()) - 1; i >= 0; --i)
    {
        string trackKey = fileList[i] + string("_#") + int32ToStr(i) + string("_");
        if (addParams.find("subClip") == addParams.end())
            trackKey += string("_track_");
        else
            trackKey += string("_subtrack_");
        trackKey += int32ToStr(pid);
        if (m_processedTracks.find(trackKey) != m_processedTracks.end())
            fileList.erase(fileList.begin() + i);
        else
            m_processedTracks.insert(trackKey);
    }
    if (fileList.empty())
        return -1;

    FileListIterator* listIterator = nullptr;
    if (fileList.size() > 1)
    {
        listIterator = new FileListIterator();
        m_iterators.push_back(listIterator);
        for (const string& fileName : fileList) listIterator->addFile(fileName);
    }

    int64_t fileSize = 0;

    if (m_containerReader.m_demuxers.find(fileList[0]) == m_containerReader.m_demuxers.end())
    {
        File tmpFile;
        for (const string& fileName : fileList)
        {
            if (!tmpFile.open(fileName.c_str(), File::ofRead))
                THROW(ERR_INVALID_CODEC_FORMAT, "Can't open file: " << fileName.c_str())
            int64_t tmpSize = 0;
            tmpFile.size(&tmpSize);
            fileSize += tmpSize;
            tmpFile.close();
        }
    }

    AbstractStreamReader* codecReader = createCodec(codec, addParams, fileList[0], mergePlayItems(mplsInfoList));
    codecReader->setStreamIndex(static_cast<int>(m_codecInfo.size() + 1));
    codecReader->setTimeOffset(m_timeOffset);

    if (m_codecInfo.empty())
        codecReader->m_flags |= AVPacket::PCR_STREAM;

    AbstractReader* dataReader;
    string tmpname = strToLowerCase(fileList[0]);
    tmpname = unquoteStr(trimStr(tmpname));

    if (strEndWith(tmpname, ".h264") || strEndWith(tmpname, ".264") || strEndWith(tmpname, ".mvc"))
    {
        if (pid)
        {
            dataReader = &m_containerReader;
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMultiH264);
            if (listIterator)
                dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        }
        else
        {
            dataReader = m_readManager.getReader(fileList[0].c_str());
        }
    }
    else if (strEndWith(tmpname, ".ts") || strEndWith(tmpname, ".m2ts") || strEndWith(tmpname, ".mts") ||
             strEndWith(tmpname, ".ssif"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside TS/M2TS container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".ts"))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctTS);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctM2TS);
    }
    else if (strEndWith(tmpname, ".vob") || strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".mpg"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MPG/VOB/EVO container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".evo\""))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctEVOB);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctVOB);
    }
    else if (strEndWith(tmpname, ".mkv") || strEndWith(tmpname, ".mka") || strEndWith(tmpname, ".mks"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MKV container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMKV);
    }
    else if (strEndWith(tmpname, ".mov") || strEndWith(tmpname, ".mp4") || strEndWith(tmpname, ".m4v") ||
             strEndWith(tmpname, ".m4a"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MOV/MP4 container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMOV);
    }
    else
    {
        dataReader = m_readManager.getReader(fileList[0].c_str());
    }
    if (dataReader == nullptr)
    {
        delete codecReader;
        THROW(ERR_INVALID_CODEC_FORMAT, "This version do not support multicast or other network steams for muxing")
    }

    m_codecInfo.emplace_back(dataReader, codecReader, fileList[0], codecStreamName, pid, isSubStream);
    if (listIterator)
    {
        auto fileReader = dynamic_cast<BufferedFileReader*>(dataReader);
        if (fileReader)
            fileReader->setFileIterator(listIterator, m_codecInfo.rbegin()->m_readerID);
    }

    StreamInfo& streamInfo = *m_codecInfo.rbegin();
    streamInfo.m_codec = codec;
    streamInfo.m_addParams = addParams;
    int streamIndex = codecReader->getStreamIndex();

    // fields for SS PG stream
    auto pgStream = dynamic_cast<PGSStreamReader*>(codecReader);
    if (pgStream)
    {
        pgStream->isSSPG = isSSPG;
        pgStream->ssPGOffset = ssPGOffset;
        pgStream->leftEyeSubStreamIdx = leftEyeSubStreamIdx;
        pgStream->rightEyeSubStreamIdx = rightEyeSubStreamIdx;
    }
    //

    auto itr = addParams.find("timeshift");
    if (itr != addParams.end())
    {
        string timeShift = itr->second;
        size_t pos = 0;
        int64_t coeff = 1;
        int64_t value = 0;
        if ((pos = timeShift.find("ms")) != std::string::npos)
        {
            coeff = 1000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find('s')) != std::string::npos)
        {
            coeff = 1000000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find("ns")) != std::string::npos)
        {
            coeff = 1;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else
        {
            coeff = 1000000;
            value = strToInt32(timeShift.c_str());
        }
        value = value * coeff / 1000 * INTERNAL_PTS_FREQ / 1000000;
        streamInfo.m_timeShift = value;
        if (value > 0)
            streamInfo.m_lastDTS = value;
    }

    itr = addParams.find("lang");
    if (itr != addParams.end())
        streamInfo.m_lang = itr->second;
    m_totalSize += fileSize;

    return streamIndex;
}